

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall
QCss::ValueExtractor::extractBorder
          (ValueExtractor *this,int *borders,QBrush *colors,BorderStyle *styles,QSize *radii)

{
  BorderStyle *style;
  QBrush *color;
  BorderStyle *pBVar1;
  QBrush *this_00;
  QBrush *this_01;
  QPalette *pal;
  BorderStyle *width;
  Declaration *pDVar2;
  DeclarationData *pDVar3;
  _Head_base<0UL,_QBrushData_*,_false> _Var4;
  bool bVar5;
  BorderStyle BVar6;
  int iVar7;
  BorderStyle *pBVar8;
  QBrush *pQVar9;
  QSize QVar10;
  long lVar11;
  BorderStyle *pBVar12;
  BorderStyle *width_00;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  int dummy;
  _Head_base<0UL,_QBrushData_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    local_40._M_head_impl._0_4_ = 0xffffff01;
    extractFont(this,&this->f,(int *)&local_40);
  }
  if ((this->declarations).d.size == 0) {
    bVar5 = false;
  }
  else {
    width = (BorderStyle *)(borders + 3);
    style = styles + 3;
    color = colors + 3;
    pBVar1 = styles + 2;
    pBVar8 = styles + 1;
    this_00 = colors + 2;
    this_01 = colors + 1;
    uVar13 = 0;
    bVar5 = false;
    do {
      pDVar2 = (this->declarations).d.ptr;
      pDVar3 = pDVar2[uVar13].d.d.ptr;
      if (0x21 < pDVar3->propertyId - Border) goto switchD_005d95d4_caseD_1f;
      pal = (QPalette *)(pDVar2 + uVar13);
      switch(pDVar3->propertyId) {
      case Border:
        borderValue(this,(Declaration *)pal,(int *)width,style,color);
        iVar7 = borders[3];
        borders[2] = iVar7;
        borders[1] = iVar7;
        *borders = iVar7;
        BVar6 = styles[3];
        styles[2] = BVar6;
        styles[1] = BVar6;
        *styles = BVar6;
        pQVar9 = QBrush::operator=(this_00,color);
        pQVar9 = QBrush::operator=(this_01,pQVar9);
        QBrush::operator=(colors,pQVar9);
        break;
      case BorderLeft:
        pBVar12 = style;
        width_00 = width;
        pQVar9 = color;
        goto LAB_005d9789;
      case BorderRight:
        pBVar12 = pBVar8;
        width_00 = (BorderStyle *)(borders + 1);
        pQVar9 = this_01;
        goto LAB_005d9789;
      case BorderTop:
        pBVar12 = styles;
        width_00 = (BorderStyle *)borders;
        pQVar9 = colors;
        goto LAB_005d9789;
      case BorderBottom:
        pBVar12 = pBVar1;
        width_00 = (BorderStyle *)(borders + 2);
        pQVar9 = this_00;
LAB_005d9789:
        borderValue(this,(Declaration *)pal,(int *)width_00,pBVar12,pQVar9);
        break;
      default:
        goto switchD_005d95d4_caseD_1f;
      case BorderLeftStyle:
        BVar6 = BorderStyle_None;
        pBVar12 = style;
        if ((pDVar3->values).d.size == 1) {
          BVar6 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005d98a8;
      case BorderRightStyle:
        BVar6 = BorderStyle_None;
        pBVar12 = pBVar8;
        if ((pDVar3->values).d.size == 1) {
          BVar6 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005d98a8;
      case BorderTopStyle:
        BVar6 = BorderStyle_None;
        pBVar12 = styles;
        if ((pDVar3->values).d.size == 1) {
          BVar6 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005d98a8;
      case BorderBottomStyle:
        BVar6 = BorderStyle_None;
        pBVar12 = pBVar1;
        if ((pDVar3->values).d.size == 1) {
          BVar6 = parseStyleValue((pDVar3->values).d.ptr);
        }
        goto LAB_005d98a8;
      case BorderStyles:
        Declaration::styleValues((Declaration *)pal,styles);
        break;
      case BorderLeftColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar9 = color;
        goto LAB_005d974a;
      case BorderRightColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar9 = this_01;
        goto LAB_005d974a;
      case BorderTopColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar9 = colors;
        goto LAB_005d974a;
      case BorderBottomColor:
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar9 = this_00;
LAB_005d974a:
        _Var4._M_head_impl =
             (pQVar9->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (pQVar9->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
        local_40._M_head_impl = _Var4._M_head_impl;
        QBrush::~QBrush((QBrush *)&local_40);
        break;
      case BorderColor:
        Declaration::brushValues((Declaration *)pal,colors,&this->pal);
        break;
      case BorderLeftWidth:
        BVar6 = lengthValue(this,(Declaration *)pal);
        pBVar12 = width;
        goto LAB_005d98a8;
      case BorderRightWidth:
        BVar6 = lengthValue(this,(Declaration *)pal);
        pBVar12 = (BorderStyle *)(borders + 1);
        goto LAB_005d98a8;
      case BorderTopWidth:
        iVar7 = lengthValue(this,(Declaration *)pal);
        *borders = iVar7;
        break;
      case BorderBottomWidth:
        BVar6 = lengthValue(this,(Declaration *)pal);
        pBVar12 = (BorderStyle *)(borders + 2);
LAB_005d98a8:
        *pBVar12 = BVar6;
        break;
      case BorderWidth:
        lengthValues(this,(Declaration *)pal,borders);
        break;
      case BorderTopLeftRadius:
        QVar10 = sizeValue(this,(Declaration *)pal);
        *radii = QVar10;
        break;
      case BorderTopRightRadius:
        QVar10 = sizeValue(this,(Declaration *)pal);
        radii[1] = QVar10;
        break;
      case BorderBottomLeftRadius:
        QVar10 = sizeValue(this,(Declaration *)pal);
        radii[2] = QVar10;
        break;
      case BorderBottomRightRadius:
        QVar10 = sizeValue(this,(Declaration *)pal);
        radii[3] = QVar10;
        break;
      case BorderRadius:
        QVar10 = sizeValue(this,(Declaration *)pal);
        *radii = QVar10;
        lVar11 = 0;
        do {
          auVar14._8_4_ = (int)lVar11;
          auVar14._0_8_ = lVar11;
          auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar14 = (auVar14 | _DAT_00674840) ^ _DAT_00674850;
          if (auVar14._4_4_ == -0x80000000 && auVar14._0_4_ < -0x7ffffffd) {
            radii[lVar11 + 1] = QVar10;
            radii[lVar11 + 2] = QVar10;
          }
          lVar11 = lVar11 + 2;
        } while (lVar11 != 4);
      }
      bVar5 = true;
switchD_005d95d4_caseD_1f:
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool ValueExtractor::extractBorder(int *borders, QBrush *colors, BorderStyle *styles,
                                   QSize *radii)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case BorderLeftWidth: borders[LeftEdge] = lengthValue(decl); break;
        case BorderRightWidth: borders[RightEdge] = lengthValue(decl); break;
        case BorderTopWidth: borders[TopEdge] = lengthValue(decl); break;
        case BorderBottomWidth: borders[BottomEdge] = lengthValue(decl); break;
        case BorderWidth: lengthValues(decl, borders); break;

        case BorderLeftColor: colors[LeftEdge] = decl.brushValue(pal); break;
        case BorderRightColor: colors[RightEdge] = decl.brushValue(pal); break;
        case BorderTopColor: colors[TopEdge] = decl.brushValue(pal); break;
        case BorderBottomColor: colors[BottomEdge] = decl.brushValue(pal); break;
        case BorderColor: decl.brushValues(colors, pal); break;

        case BorderTopStyle: styles[TopEdge] = decl.styleValue(); break;
        case BorderBottomStyle: styles[BottomEdge] = decl.styleValue(); break;
        case BorderLeftStyle: styles[LeftEdge] = decl.styleValue(); break;
        case BorderRightStyle: styles[RightEdge] = decl.styleValue(); break;
        case BorderStyles:  decl.styleValues(styles); break;

        case BorderTopLeftRadius: radii[0] = sizeValue(decl); break;
        case BorderTopRightRadius: radii[1] = sizeValue(decl); break;
        case BorderBottomLeftRadius: radii[2] = sizeValue(decl); break;
        case BorderBottomRightRadius: radii[3] = sizeValue(decl); break;
        case BorderRadius: sizeValues(decl, radii); break;

        case BorderLeft:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            break;
        case BorderTop:
            borderValue(decl, &borders[TopEdge], &styles[TopEdge], &colors[TopEdge]);
            break;
        case BorderRight:
            borderValue(decl, &borders[RightEdge], &styles[RightEdge], &colors[RightEdge]);
            break;
        case BorderBottom:
            borderValue(decl, &borders[BottomEdge], &styles[BottomEdge], &colors[BottomEdge]);
            break;
        case Border:
            borderValue(decl, &borders[LeftEdge], &styles[LeftEdge], &colors[LeftEdge]);
            borders[TopEdge] = borders[RightEdge] = borders[BottomEdge] = borders[LeftEdge];
            styles[TopEdge] = styles[RightEdge] = styles[BottomEdge] = styles[LeftEdge];
            colors[TopEdge] = colors[RightEdge] = colors[BottomEdge] = colors[LeftEdge];
            break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}